

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void handle_request_stat_log(mg_connection *conn)

{
  mg_connection *conn_local;
  
  handle_request(conn);
  if ((conn->phys_ctx->callbacks).end_request != (_func_void_mg_connection_ptr_int *)0x0) {
    (*(conn->phys_ctx->callbacks).end_request)(conn,conn->status_code);
  }
  log_access(conn);
  return;
}

Assistant:

static void
handle_request_stat_log(struct mg_connection *conn)
{
#if defined(USE_SERVER_STATS)
	struct timespec tnow;
	conn->conn_state = 4; /* processing */
#endif

	handle_request(conn);


#if defined(USE_SERVER_STATS)
	conn->conn_state = 5; /* processed */

	clock_gettime(CLOCK_MONOTONIC, &tnow);
	conn->processing_time = mg_difftimespec(&tnow, &(conn->req_time));

	mg_atomic_add64(&(conn->phys_ctx->total_data_read), conn->consumed_content);
	mg_atomic_add64(&(conn->phys_ctx->total_data_written),
	                conn->num_bytes_sent);
#endif

	DEBUG_TRACE("%s", "handle_request done");

	if (conn->phys_ctx->callbacks.end_request != NULL) {
		conn->phys_ctx->callbacks.end_request(conn, conn->status_code);
		DEBUG_TRACE("%s", "end_request callback done");
	}
	log_access(conn);
}